

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

uint16_t __thiscall ast::Section::read16(Section *this,uint offset)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar1 = 0x55;
  if (offset < this->content_size) {
    uVar1 = (ushort)this->content[offset];
  }
  uVar2 = 0x5500;
  if (offset + 1 < this->content_size) {
    uVar2 = (ushort)this->content[(ulong)offset + 1] << 8;
  }
  return uVar1 | uVar2;
}

Assistant:

uint16_t Section::read16(unsigned offset)
{
	uint16_t byte0 = 0x55, byte1 = 0x55;
	if (offset < content_size)
		byte0 = *(content + offset);
	if (offset + 1 < content_size)
		byte1 = *(content + offset + 1);
	return (byte1 << 8) + byte0;
}